

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_new.c
# Opt level: O0

mpt_metatype * mpt_meta_new(mpt_value *val)

{
  int iVar1;
  char *src_00;
  int *piVar2;
  mpt_type_traits *traits_00;
  mpt_buffer *buf_00;
  long lVar3;
  mpt_buffer *local_60;
  size_t reserve;
  mpt_type_traits *traits;
  mpt_buffer *buf;
  mpt_array a;
  size_t len;
  char *text;
  void *src;
  mpt_metatype *mt;
  mpt_value *val_local;
  
  text = (char *)val->_addr;
  mt = (mpt_metatype *)val;
  src_00 = mpt_data_tostring(&text,val->_type,(size_t *)&a);
  if (src_00 == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return (mpt_metatype *)0x0;
  }
  if (a._buf < (mpt_buffer *)0xff) {
    src = mpt_meta_geninfo((size_t)a._buf);
    if ((((mpt_metatype *)src != (mpt_metatype *)0x0) && (text != (char *)0x0)) &&
       (iVar1 = _mpt_geninfo_set((mpt_metatype *)((long)src + 8),src_00,(int)a._buf), iVar1 < 0)) {
      (**(code **)(*src + 8))(src);
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return (mpt_metatype *)0x0;
    }
    return (mpt_metatype *)src;
  }
  memset(&buf,0,8);
  traits_00 = mpt_type_traits(99);
  if (traits_00 == (mpt_type_traits *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return (mpt_metatype *)0x0;
  }
  if ((a._buf == (mpt_buffer *)0x0) || (src_00[(long)((long)&a._buf[-1]._used + 7)] == '\0')) {
    local_60 = a._buf;
  }
  else {
    local_60 = (mpt_buffer *)((long)&(a._buf)->_vptr + 1);
  }
  buf_00 = mpt_array_reserve((mpt_array *)&buf,(size_t)local_60,traits_00);
  if (buf_00 != (mpt_buffer *)0x0) {
    lVar3 = mpt_buffer_set(buf_00,traits_00,(size_t)a._buf,src_00,0);
    if ((lVar3 == 0) ||
       ((a._buf < local_60 &&
        (lVar3 = mpt_buffer_set(buf_00,traits_00,1,"",(size_t)a._buf), lVar3 == 0)))) {
      mpt_array_clone((mpt_array *)&buf,(mpt_array *)0x0);
      val_local = (mpt_value *)0x0;
    }
    else {
      src = mpt_meta_buffer((mpt_array *)&buf);
      mpt_array_clone((mpt_array *)&buf,(mpt_array *)0x0);
      val_local = (mpt_value *)src;
    }
    return (mpt_metatype *)val_local;
  }
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_meta_new(const MPT_STRUCT(value) *val)
{
	MPT_INTERFACE(metatype) *mt;
	const void *src;
	const char *text;
	size_t len;
	
	src = val->_addr;
	if (!(text = mpt_data_tostring(&src, val->_type, &len))) {
		/* TODO generic type representation */
		errno = EINVAL;
		return 0;
	}
	/* data too big for basic type */
	if (len >= UINT8_MAX) {
		MPT_STRUCT(array) a = MPT_ARRAY_INIT;
		MPT_STRUCT(buffer) *buf;
		const MPT_STRUCT(type_traits) *traits;
		size_t reserve;
		
		if (!(traits = mpt_type_traits('c'))) {
			errno = EINVAL;
			return 0;
		}
		/* create new text data array */
		reserve = (len && text[len - 1]) ? len + 1 : len;
		if (!(buf = mpt_array_reserve(&a, reserve, traits))) {
			return 0;
		}
		if (!mpt_buffer_set(buf, traits, len, text, 0)
		 || ((reserve > len) && !mpt_buffer_set(buf, traits, 1, "", len))) {
			mpt_array_clone(&a, 0);
			return 0;
		}
		/* metatype with buffer text store */
		mt = mpt_meta_buffer(&a);
		mpt_array_clone(&a, 0);
		return mt;
	}
	if (!(mt = mpt_meta_geninfo(len))
	    || !src
	    || _mpt_geninfo_set(mt + 1, text, len) >= 0) {
		return mt;
	}
	mt->_vptr->unref(mt);
	errno = EINVAL;
	return 0;
}